

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_parameterization_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::SurfaceVertexParameterizationQuantity::fillColorBuffers
          (SurfaceVertexParameterizationQuantity *this,ShaderProgram *p)

{
  size_type __n;
  size_type __n_00;
  size_type __n_01;
  value_type *this_00;
  reference this_01;
  size_type sVar1;
  reference pvVar2;
  long *in_RSI;
  long in_RDI;
  size_t vC;
  size_t vB;
  size_t j;
  size_t vRoot;
  size_t D;
  value_type *face;
  size_t iF;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  coordVal;
  value_type *__x;
  size_type in_stack_ffffffffffffff68;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *in_stack_ffffffffffffff70;
  size_type local_60;
  value_type *local_40;
  undefined1 local_28 [24];
  long *local_10;
  
  local_10 = in_RSI;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)0x3c0e51);
  SurfaceMesh::nFacesTriangulation((SurfaceMesh *)0x3c0e5f);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::reserve(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_40 = (value_type *)0x0;
  while( true ) {
    __x = local_40;
    this_00 = (value_type *)SurfaceMesh::nFaces((SurfaceMesh *)0x3c0ea5);
    if (this_00 <= __x) break;
    this_01 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)(*(long *)(in_RDI + 8) + 0x2e0),(size_type)local_40);
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_01);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_01,0);
    __n = *pvVar2;
    for (local_60 = 1; local_60 + 1 < sVar1; local_60 = local_60 + 1) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (this_01,local_60);
      __n_00 = *pvVar2;
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (this_01,(local_60 + 1) % sVar1);
      __n_01 = *pvVar2;
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    *)(in_RDI + 0x1f0),__n);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   *)this_00,__x);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    *)(in_RDI + 0x1f0),__n_00);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   *)this_00,__x);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    *)(in_RDI + 0x1f0),__n_01);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   *)this_00,__x);
    }
    local_40 = (value_type *)((long)&local_40->field_0 + 1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff70,"a_value2",(allocator *)&stack0xffffffffffffff6f);
  (**(code **)(*local_10 + 0x78))(local_10,&stack0xffffffffffffff70,local_28,0,0,0xffffffff);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             *)this_00);
  return;
}

Assistant:

void SurfaceVertexParameterizationQuantity::fillColorBuffers(render::ShaderProgram& p) {
  std::vector<glm::vec2> coordVal;
  coordVal.reserve(3 * parent.nFacesTriangulation());

  for (size_t iF = 0; iF < parent.nFaces(); iF++) {
    auto& face = parent.faces[iF];
    size_t D = face.size();

    // implicitly triangulate from root
    size_t vRoot = face[0];
    for (size_t j = 1; (j + 1) < D; j++) {
      size_t vB = face[j];
      size_t vC = face[(j + 1) % D];

      coordVal.push_back(coords[vRoot]);
      coordVal.push_back(coords[vB]);
      coordVal.push_back(coords[vC]);
    }
  }

  // Store data in buffers
  p.setAttribute("a_value2", coordVal);
}